

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetDMatrix(XL *out,char *key,DataHandle *out_data)

{
  XLearn *this;
  DMatrix *pDVar1;
  int iVar2;
  HyperParam *pHVar3;
  runtime_error *this_00;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  iVar2 = strcmp(in_RSI,"train");
  if (iVar2 == 0) {
    pDVar1 = (DMatrix *)*in_RDX;
    pHVar3 = XLearn::GetHyperParam(this);
    pHVar3->train_dataset = pDVar1;
    pHVar3 = XLearn::GetHyperParam(this);
    if ((pHVar3->train_dataset->has_label & 1U) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Train set must have label!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar2 = strcmp(in_RSI,"test");
    if (iVar2 == 0) {
      pDVar1 = (DMatrix *)*in_RDX;
      pHVar3 = XLearn::GetHyperParam(this);
      pHVar3->test_dataset = pDVar1;
    }
    else {
      iVar2 = strcmp(in_RSI,"validate");
      if (iVar2 == 0) {
        pDVar1 = (DMatrix *)*in_RDX;
        pHVar3 = XLearn::GetHyperParam(this);
        pHVar3->valid_dataset = pDVar1;
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetDMatrix(XL *out, const char *key, DataHandle *out_data){
  API_BEGIN()
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "train") == 0) {
    xl->GetHyperParam().train_dataset = reinterpret_cast<xLearn::DMatrix*>(*out_data);
    if (!xl->GetHyperParam().train_dataset->has_label){
      throw std::runtime_error("Train set must have label!");
    }
  } else if (strcmp(key, "test") == 0) {
    xl->GetHyperParam().test_dataset = reinterpret_cast<xLearn::DMatrix*>(*out_data);
  } else if (strcmp(key, "validate") == 0) {
    xl->GetHyperParam().valid_dataset = reinterpret_cast<xLearn::DMatrix*>(*out_data);
  }
  API_END();
}